

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Indexes.cpp
# Opt level: O1

Keylet * __thiscall
jbcoin::keylet::ticket_t::operator()
          (Keylet *__return_storage_ptr__,ticket_t *this,AccountID *id,uint32_t seq)

{
  uint *in_R8;
  undefined2 local_e;
  uint32_t local_c;
  
  local_e = 0x54;
  local_c = seq;
  sha512Half<unsigned_short,jbcoin::base_uint<160ul,jbcoin::detail::AccountIDTag>,unsigned_int>
            (&__return_storage_ptr__->key,(jbcoin *)&local_e,(unsigned_short *)id,
             (base_uint<160UL,_jbcoin::detail::AccountIDTag> *)&stack0xfffffffffffffff4,in_R8);
  __return_storage_ptr__->type = ltTICKET;
  return __return_storage_ptr__;
}

Assistant:

Keylet ticket_t::operator()(AccountID const& id,
    std::uint32_t seq) const
{
    return { ltTICKET,
        getTicketIndex(id, seq) };
}